

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.hpp
# Opt level: O3

void __thiscall tf::Executor::~Executor(Executor *this)

{
  size_t sVar1;
  pointer pWVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  pointer pWVar3;
  long lVar4;
  ulong uVar5;
  Worker *w;
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> local_30;
  
  local_30._M_device = &this->_topology_mutex;
  local_30._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_30);
  local_30._M_owns = true;
  sVar1 = this->_num_topologies;
  while (sVar1 != 0) {
    std::condition_variable::wait((unique_lock *)&this->_topology_cv);
    sVar1 = this->_num_topologies;
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_30);
  pWVar3 = (this->_workers).super__Vector_base<tf::Worker,_std::allocator<tf::Worker>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->_workers).super__Vector_base<tf::Worker,_std::allocator<tf::Worker>_>._M_impl.
      super__Vector_impl_data._M_finish != pWVar3) {
    lVar4 = 0;
    uVar5 = 0;
    do {
      (&pWVar3->_done)[lVar4]._M_base._M_i = true;
      uVar5 = uVar5 + 1;
      pWVar3 = (this->_workers).super__Vector_base<tf::Worker,_std::allocator<tf::Worker>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar4 = lVar4 + 0x980;
    } while (uVar5 < (ulong)(((long)(this->_workers).
                                    super__Vector_base<tf::Worker,_std::allocator<tf::Worker>_>.
                                    _M_impl.super__Vector_impl_data._M_finish - (long)pWVar3 >> 7) *
                            -0x79435e50d79435e5));
  }
  NonblockingNotifierV2::_notify<true>(&this->_notifier);
  pWVar2 = (this->_workers).super__Vector_base<tf::Worker,_std::allocator<tf::Worker>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pWVar3 = (this->_workers).super__Vector_base<tf::Worker,_std::allocator<tf::Worker>_>._M_impl
                .super__Vector_impl_data._M_start; pWVar3 != pWVar2; pWVar3 = pWVar3 + 1) {
    std::thread::join();
  }
  std::
  _Hashtable<std::shared_ptr<tf::ObserverInterface>,_std::shared_ptr<tf::ObserverInterface>,_std::allocator<std::shared_ptr<tf::ObserverInterface>_>,_std::__detail::_Identity,_std::equal_to<std::shared_ptr<tf::ObserverInterface>_>,_std::hash<std::shared_ptr<tf::ObserverInterface>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&(this->_observers)._M_h);
  this_00 = (this->_worker_interface).
            super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  std::vector<tf::Freelist<tf::Node_*>::Bucket,_std::allocator<tf::Freelist<tf::Node_*>::Bucket>_>::
  ~vector(&(this->_buffers)._buckets);
  std::__cxx11::_List_base<tf::Taskflow,_std::allocator<tf::Taskflow>_>::_M_clear
            (&(this->_taskflows).super__List_base<tf::Taskflow,_std::allocator<tf::Taskflow>_>);
  std::condition_variable::~condition_variable(&this->_topology_cv);
  std::vector<tf::NonblockingNotifierV2::Waiter,_std::allocator<tf::NonblockingNotifierV2::Waiter>_>
  ::~vector(&(this->_notifier)._waiters);
  std::vector<tf::Worker,_std::allocator<tf::Worker>_>::~vector(&this->_workers);
  return;
}

Assistant:

inline Executor::~Executor() {

  // wait for all topologies to complete
  wait_for_all();

  // shut down the scheduler
  for(size_t i=0; i<_workers.size(); ++i) {
  #if __cplusplus >= TF_CPP20
    _workers[i]._done.test_and_set(std::memory_order_relaxed);
  #else
    _workers[i]._done.store(true, std::memory_order_relaxed);
  #endif
  }

  _notifier.notify_all();

  for(auto& w : _workers) {
    w._thread.join();
  }
}